

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

QSize __thiscall QColumnView::sizeHint(QColumnView *this)

{
  long lVar1;
  QColumnViewPrivate *pQVar2;
  QSize *otherSize;
  qsizetype qVar3;
  const_reference ppQVar4;
  QSize QVar5;
  QSize *in_RDI;
  long in_FS_OFFSET;
  int i;
  QColumnViewPrivate *d;
  QSize sizeHint;
  QSize *in_stack_ffffffffffffffa8;
  QSize *in_stack_ffffffffffffffb0;
  int local_3c;
  QAbstractScrollArea *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QColumnView *)0x86491a);
  QSize::QSize(in_stack_ffffffffffffffb0);
  local_3c = 0;
  while( true ) {
    otherSize = (QSize *)(long)local_3c;
    qVar3 = QList<QAbstractItemView_*>::size(&pQVar2->columns);
    if (qVar3 <= (long)otherSize) break;
    ppQVar4 = QList<QAbstractItemView_*>::at
                        ((QList<QAbstractItemView_*> *)otherSize,
                         (qsizetype)in_stack_ffffffffffffffa8);
    (**(code **)(*(long *)&((*ppQVar4)->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x70
                ))();
    QSize::operator+=(otherSize,in_stack_ffffffffffffffa8);
    local_3c = local_3c + 1;
  }
  QAbstractScrollArea::sizeHint(in_stack_ffffffffffffffd8);
  QVar5 = QSize::expandedTo(in_RDI,otherSize);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QSize QColumnView::sizeHint() const
{
    Q_D(const QColumnView);
    QSize sizeHint;
    for (int i = 0; i < d->columns.size(); ++i) {
        sizeHint += d->columns.at(i)->sizeHint();
    }
    return sizeHint.expandedTo(QAbstractItemView::sizeHint());
}